

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O2

void Wlc_NtkCheckIntegrity(void *pData)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *p;
  char *pcVar6;
  int extraout_EDX;
  int extraout_EDX_00;
  uint uVar7;
  ulong uVar8;
  int *pArray;
  
  p = Vec_IntAlloc(100);
  for (uVar7 = 3; iVar2 = *(int *)(*(long *)((long)pData + 0x10) + 8), (int)uVar7 < iVar2 + 2;
      uVar7 = uVar7 + iVar2) {
    iVar2 = Ndr_DataType((Ndr_Data_t *)pData,uVar7);
    if (iVar2 == 3) {
      uVar3 = Ndr_ObjReadBody((Ndr_Data_t *)pData,uVar7,5);
      if (uVar3 == 0xffffffff) {
        iVar2 = Ndr_ObjReadBody((Ndr_Data_t *)pData,uVar7,6);
        if (iVar2 != 4) {
          pcVar6 = Abc_OperName(iVar2);
          printf("Internal object %d of type %s has no output name.\n",(ulong)uVar7,pcVar6);
        }
      }
      else {
        iVar4 = Vec_IntGetEntry(p,uVar3);
        iVar2 = extraout_EDX;
        if (0 < iVar4) {
          uVar5 = Vec_IntGetEntry(p,uVar3);
          printf("Output name %d is used more than once (obj %d and obj %d).\n",(ulong)uVar3,
                 (ulong)uVar5,(ulong)uVar7);
          iVar2 = extraout_EDX_00;
        }
        Vec_IntFillExtra(p,uVar3 + 1,iVar2);
        Vec_IntWriteEntry(p,uVar3,uVar7);
      }
    }
    iVar2 = Ndr_DataSize((Ndr_Data_t *)pData,uVar7);
  }
  for (uVar7 = 3; (int)uVar7 < iVar2 + 2; uVar7 = uVar7 + iVar4) {
    iVar2 = Ndr_DataType((Ndr_Data_t *)pData,uVar7);
    if (iVar2 == 3) {
      iVar2 = Ndr_ObjReadBody((Ndr_Data_t *)pData,uVar7,6);
      uVar3 = Ndr_ObjReadArray((Ndr_Data_t *)pData,uVar7,4,&pArray);
      piVar1 = pArray;
      if ((int)uVar3 < 1) {
        uVar3 = 0;
      }
      for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
        iVar4 = Vec_IntGetEntry(p,piVar1[uVar8]);
        if ((iVar4 == 0) && (iVar2 != 0x59 || 2 < (int)uVar8 - 5U)) {
          printf("Input name %d appearing as fanin %d of obj %d is not used as output name in any object.\n"
                 ,(ulong)(uint)piVar1[uVar8],uVar8 & 0xffffffff,(ulong)uVar7);
        }
      }
    }
    iVar4 = Ndr_DataSize((Ndr_Data_t *)pData,uVar7);
    iVar2 = *(int *)(*(long *)((long)pData + 0x10) + 8);
  }
  Vec_IntFree(p);
  return;
}

Assistant:

void Wlc_NtkCheckIntegrity( void * pData )
{
    Ndr_Data_t * p = (Ndr_Data_t *)pData;  
    Vec_Int_t * vMap = Vec_IntAlloc( 100 );
    int Mod = 2, Obj;
    Ndr_ModForEachObj( p, Mod, Obj )
    {
        int NameId  = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        if ( NameId == -1 )
        {
            int Type = Ndr_ObjReadBody( p, Obj, NDR_OPERTYPE );
            if ( Type != ABC_OPER_CO )
                printf( "Internal object %d of type %s has no output name.\n", Obj, Abc_OperName(Type) );
            continue;
        }
        if ( Vec_IntGetEntry(vMap, NameId) > 0 )
            printf( "Output name %d is used more than once (obj %d and obj %d).\n", NameId, Vec_IntGetEntry(vMap, NameId), Obj );
        Vec_IntSetEntry( vMap, NameId, Obj );
    }
    Ndr_ModForEachObj( p, Mod, Obj )
    {
        int Type = Ndr_ObjReadBody( p, Obj, NDR_OPERTYPE );
        int i, * pArray, nArray  = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        for ( i = 0; i < nArray; i++ )
            if ( Vec_IntGetEntry(vMap, pArray[i]) == 0 && !(Type == ABC_OPER_DFFRSE && (i >= 5 && i <= 7)) )
                printf( "Input name %d appearing as fanin %d of obj %d is not used as output name in any object.\n", pArray[i], i, Obj );
    }
    Vec_IntFree( vMap );
}